

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

void __thiscall Assimp::FIHexValueImpl::~FIHexValueImpl(FIHexValueImpl *this)

{
  FIHexValueImpl *this_local;
  
  (this->super_FIHexValue).super_FIByteValue.super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__0111a6c8;
  std::__cxx11::string::~string((string *)&this->strValue);
  FIHexValue::~FIHexValue(&this->super_FIHexValue);
  return;
}

Assistant:

inline FIHexValueImpl(std::vector<uint8_t> &&value_):  strValueValid(false) { value = std::move(value_); }